

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_announce_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  pointer pbVar1;
  type_conflict2 tVar2;
  size_type __n;
  long lVar3;
  undefined4 uVar4;
  size_type sVar5;
  pointer pbVar6;
  bool bVar7;
  uchar *local_190;
  long local_188;
  undefined4 local_17c;
  ipv4_peer_entry e;
  shared_ptr<libtorrent::aux::request_callback> cb;
  list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ip_list;
  tracker_response resp;
  
  if (0x13 < buf.m_len) {
    local_190 = (uchar *)(buf.m_ptr + 8);
    local_188 = buf.m_len + -8;
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    resp.trackerid._M_dataplus._M_p = (pointer)&resp.trackerid.field_2;
    resp.external_ip.ipv6_address_._8_16_ = (undefined1  [16])0x0;
    resp.external_ip._0_16_ = (undefined1  [16])0x0;
    resp.i2p_peers.
    super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resp.i2p_peers.
    super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resp.peers6.
    super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resp.i2p_peers.
    super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resp.peers6.
    super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resp.peers6.
    super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resp.peers4.
    super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resp.peers4.
    super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resp.peers.
    super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resp.peers4.
    super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resp.peers.
    super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resp.peers.
    super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resp.trackerid._M_string_length = 0;
    resp.trackerid.field_2._M_local_buf[0] = '\0';
    resp.failure_reason._M_dataplus._M_p = (pointer)&resp.failure_reason.field_2;
    resp.failure_reason._M_string_length = 0;
    resp.failure_reason.field_2._M_local_buf[0] = '\0';
    resp.warning_message._M_dataplus._M_p = (pointer)&resp.warning_message.field_2;
    resp.warning_message._M_string_length = 0;
    resp.warning_message.field_2._M_local_buf[0] = '\0';
    resp.interval.__r = 0x708;
    resp.min_interval.__r = 1;
    resp.complete = -1;
    resp.incomplete = -1;
    resp.downloaders = -1;
    resp.downloaded = -1;
    tVar2 = read_impl<int,char_const>(&local_190);
    resp.interval.__r =
         session_settings::get_int(((this->super_tracker_connection).m_man)->m_settings,0x4037);
    if (resp.interval.__r < tVar2) {
      resp.interval.__r = tVar2;
    }
    resp.min_interval.__r = 0x3c;
    resp.incomplete = read_impl<int,char_const>(&local_190);
    resp.complete = read_impl<int,char_const>(&local_190);
    lVar3 = 0x12;
    if ((this->m_target).impl_.data_.base.sa_family == 2) {
      lVar3 = 6;
    }
    __n = local_188 / lVar3;
    bVar7 = local_188 % lVar3 == 0;
    uVar4 = CONCAT31((int3)((uint)tVar2 >> 8),bVar7);
    if (bVar7) {
      tracker_connection::requester((tracker_connection *)&cb);
      if ((cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr == (element_type *)0x0) ||
         ((*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"<== UDP_TRACKER_RESPONSE [ url: %s ]",
                     (this->super_tracker_connection).m_req.url._M_dataplus._M_p),
         cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == (element_type *)0x0)) {
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(this);
      }
      else {
        if ((this->m_target).impl_.data_.base.sa_family == 2) {
          ::std::
          vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
          ::reserve(&resp.peers4,__n);
          sVar5 = 0;
          if (0 < (long)__n) {
            sVar5 = __n;
          }
          while (bVar7 = sVar5 != 0, sVar5 = sVar5 - 1, bVar7) {
            e.ip._M_elems = *(_Type *)local_190;
            e.port = *(ushort *)(local_190 + 4) << 8 | *(ushort *)(local_190 + 4) >> 8;
            local_190 = local_190 + 6;
            local_188 = local_188 + -6;
            ::std::
            vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            ::push_back(&resp.peers4,&e);
          }
        }
        else {
          ::std::
          vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
          ::reserve(&resp.peers6,__n);
          sVar5 = 0;
          if (0 < (long)__n) {
            sVar5 = __n;
          }
          while (bVar7 = sVar5 != 0, sVar5 = sVar5 - 1, bVar7) {
            e.ip._M_elems = SUB84(*(undefined8 *)local_190,0);
            e.port = (uint16_t)((ulong)*(undefined8 *)local_190 >> 0x20);
            local_190 = local_190 + 0x12;
            local_188 = local_188 + -0x12;
            ::std::
            vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            ::push_back(&resp.peers6,(value_type *)&e);
          }
        }
        ip_list.
        super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl._M_node._M_size = 0;
        pbVar1 = (this->m_endpoints).
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_17c = uVar4;
        ip_list.
        super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ip_list;
        ip_list.
        super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&ip_list;
        for (pbVar6 = (this->m_endpoints).
                      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; uVar4 = local_17c, pbVar6 != pbVar1
            ; pbVar6 = pbVar6 + 1) {
          bVar7 = (pbVar6->impl_).data_.base.sa_family != 2;
          if (bVar7) {
            e.port = 0;
          }
          else {
            e.port = (uint16_t)(pbVar6->impl_).data_.v4.sin_addr.s_addr;
          }
          e.ip._M_elems[1] = '\0';
          e.ip._M_elems[2] = '\0';
          e.ip._M_elems[3] = '\0';
          e.ip._M_elems[0] = bVar7;
          ::std::__cxx11::list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
          ::push_back(&ip_list,(value_type *)&e);
        }
        bVar7 = (this->m_target).impl_.data_.base.sa_family != 2;
        if (bVar7) {
          e.port = 0;
        }
        else {
          e.port = (uint16_t)(this->m_target).impl_.data_.v4.sin_addr.s_addr;
        }
        e.ip._M_elems[1] = '\0';
        e.ip._M_elems[2] = '\0';
        e.ip._M_elems[3] = '\0';
        e.ip._M_elems[0] = bVar7;
        (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_request_callback[4])
                  (cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&(this->super_tracker_connection).m_req,&e,&ip_list,&resp);
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(this);
        ::std::__cxx11::
        _List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::_M_clear
                  (&ip_list.
                    super__List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                  );
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)&e,invalid_tracker_response_length,(type *)0x0);
      fail(this,(error_code *)&e,bittorrent,"",(seconds32)0x0,(seconds32)0x1e);
    }
    tracker_response::~tracker_response(&resp);
    return (bool)(char)uVar4;
  }
  return false;
}

Assistant:

bool udp_tracker_connection::on_announce_response(span<char const> buf)
	{
		if (buf.size() < 20) return false;

		buf = buf.subspan(8);
		restart_read_timeout();

		tracker_response resp;

		resp.interval = std::max(seconds32(aux::read_int32(buf))
				, seconds32(m_man.settings().get_int(settings_pack::min_announce_interval)));
		resp.min_interval = seconds32(60);
		resp.incomplete = aux::read_int32(buf);
		resp.complete = aux::read_int32(buf);

		int const ip_stride = aux::is_v6(m_target) ? 18 : 6;
		auto const num_peers = buf.size() / ip_stride;
		if (buf.size() % ip_stride != 0)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return false;
		}

		std::shared_ptr<request_callback> cb = requester();
#ifndef TORRENT_DISABLE_LOGGING
		if (cb)
		{
			cb->debug_log("<== UDP_TRACKER_RESPONSE [ url: %s ]", tracker_req().url.c_str());
		}
#endif

		if (!cb)
		{
			close();
			return true;
		}

		if (aux::is_v6(m_target))
		{
			resp.peers6.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv6_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 16);
				buf = buf.subspan(16);
				e.port = aux::read_uint16(buf);
				resp.peers6.push_back(e);
			}
		}
		else
		{
			resp.peers4.reserve(static_cast<std::size_t>(num_peers));
			for (int i = 0; i < num_peers; ++i)
			{
				ipv4_peer_entry e{};
				std::memcpy(e.ip.data(), buf.data(), 4);
				buf = buf.subspan(4);
				e.port = aux::read_uint16(buf);
				resp.peers4.push_back(e);
			}
		}

		// TODO: why is this a linked list?
		std::list<address> ip_list;
		std::transform(m_endpoints.begin(), m_endpoints.end(), std::back_inserter(ip_list)
			, [](tcp::endpoint const& ep) { return ep.address(); } );

		cb->tracker_response(tracker_req(), m_target.address(), ip_list, resp);

		close();
		return true;
	}